

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O3

wchar_t rl_insert(wchar_t count,wchar_t c)

{
  uint uVar1;
  char arr [2];
  char local_1a [2];
  
  if ((h == (History *)0x0) || (e == (EditLine *)0x0)) {
    rl_initialize();
  }
  local_1a[1] = 0;
  if (L'\0' < count) {
    uVar1 = count + L'\x01';
    local_1a[0] = (char)c;
    do {
      el_push(e,local_1a);
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  return L'\0';
}

Assistant:

int
rl_insert(int count, int c)
{
	char arr[2];

	if (h == NULL || e == NULL)
		rl_initialize();

	/* XXX - int -> char conversion can lose on multichars */
	arr[0] = (char)c;
	arr[1] = '\0';

	for (; count > 0; count--)
		el_push(e, arr);

	return 0;
}